

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,shared_ptr<nigel::AstTerm> *cExpr,
          int priority)

{
  Type TVar1;
  int iVar2;
  element_type *peVar3;
  AST_Parser *pAVar4;
  mapped_type *pmVar5;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int in_R8D;
  bool bVar8;
  shared_ptr<nigel::AstReturning> sVar9;
  shared_ptr<nigel::AstExpr> clTerm;
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_68;
  key_type local_5c;
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *local_58;
  shared_ptr<nigel::AstExpr> *local_50;
  AST_Parser *local_48;
  _func_int **local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_68 = (element_type *)CONCAT44(in_register_0000000c,priority);
  local_88._16_8_ = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  p_Var7 = &(cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  local_58 = this_00;
  local_50 = currLVal;
  local_48 = this;
LAB_00137be2:
  TVar1 = (((cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_AstReturning).super_AstExpr.type;
  if (TVar1 == term) {
    AstExpr::as<nigel::AstTerm>((AstExpr *)&local_40);
    pmVar5 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[](this_00,(key_type *)(local_40 + 0xb));
    if (in_R8D <= *pmVar5) goto LAB_00137c13;
    bVar8 = true;
LAB_00137c78:
    if (local_38 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    this_00 = local_58;
    if (!bVar8) goto LAB_00137cc2;
LAB_00137c91:
    this_00 = local_58;
    local_88._16_8_ = (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,p_Var7);
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_88._0_8_ + 0x48);
    __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x50);
  }
  else {
LAB_00137c13:
    local_5c = op_set;
    pmVar5 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[](this_00,&local_5c);
    if (*pmVar5 == in_R8D) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_88._0_8_ + 0x58));
      iVar2 = *pmVar5;
      bVar8 = iVar2 == in_R8D;
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if (TVar1 == term) goto LAB_00137c78;
      this_00 = local_58;
      if (iVar2 != in_R8D) goto LAB_00137cc2;
      goto LAB_00137c91;
    }
    if (TVar1 == term) {
      bVar8 = false;
      goto LAB_00137c78;
    }
LAB_00137cc2:
    peVar3 = (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar3->super_AstReturning).super_AstExpr.type != returnStat) goto LAB_00137d17;
    local_88._16_8_ = peVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,p_Var7);
    AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_88._0_8_ + 0x30);
    __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var7,__r);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  goto LAB_00137be2;
LAB_00137d17:
  if ((element_type *)local_88._16_8_ == (element_type *)0x0) {
    local_50[0xb].super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68->_vptr_Token;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_50[0xb].super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68->super_enable_shared_from_this<nigel::Token>);
  }
  else {
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._16_8_ + 0x10))->_M_use_count ==
        0x12) {
      AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_88);
      *(_func_int ***)(local_88._0_8_ + 0x30) = local_68->_vptr_Token;
      p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x38);
    }
    else {
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._16_8_ + 0x10))->_M_use_count
          != 2) goto LAB_00137daa;
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
      *(_func_int ***)(local_88._0_8_ + 0x48) = local_68->_vptr_Token;
      p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x50);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var7,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &local_68->super_enable_shared_from_this<nigel::Token>);
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
LAB_00137daa:
  pAVar4 = local_48;
  sVar9 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_48);
  _Var6 = sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    _Var6._M_pi = extraout_RDX;
  }
  sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar4;
  return (shared_ptr<nigel::AstReturning>)
         sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstTerm> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;//Should be a term or a return statement
		while( true )
		{//Split all possible (unatomic) expressions
			if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::returnStat )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstReturnStatement>()->expr;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::term )
				clTerm->as<AstTerm>()->rVal = cExpr;
			else if( clTerm->type == AstExpr::Type::returnStat )
				clTerm->as<AstReturnStatement>()->expr = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}